

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O0

bool __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
          (SubjectSetRegister *this,Subject *subject_to_find)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  bool local_59;
  _Self local_48 [3];
  _Self local_30;
  iterator state;
  unique_lock<std::mutex> lck;
  Subject *subject_to_find_local;
  SubjectSetRegister *this_local;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&state,&this->mutex_);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
       ::find(&this->subject_state_,subject_to_find);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
       ::end(&this->subject_state_);
  bVar1 = std::operator==(&local_30,local_48);
  local_59 = true;
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>
             ::operator->(&local_30);
    iVar2 = SubjectState::GetState(&ppVar3->second);
    local_59 = iVar2 == 0;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&state);
  return (bool)((local_59 ^ 0xffU) & 1);
}

Assistant:

bool SubjectSetRegister::IsCurrentlySubscribed(const Subject& subject_to_find)
{
    std::unique_lock<std::mutex> lck(mutex_);
    auto state = subject_state_.find(subject_to_find);
    return !(state == subject_state_.end() || state->second.GetState() == STATE_UNSUBSCRIBED);
}